

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_CCtx_params params)

{
  ZSTD_cwksp *ws;
  U32 *pUVar1;
  void *__dest;
  undefined4 in_EAX;
  int iVar2;
  size_t err_code;
  void *pvVar3;
  size_t sVar4;
  U32 *pUVar5;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)(0x7fffffe9 < (int)(params.cParams.windowLog - 0x20 ^ 0x80000000));
  auVar6._4_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.chainLog - 0x1f ^ 0x80000000));
  auVar6._8_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.hashLog - 0x1f ^ 0x80000000));
  auVar6._12_4_ = -(uint)(0x7fffffe1 < (int)(params.cParams.searchLog - 0x1f ^ 0x80000000));
  iVar2 = movmskps(in_EAX,auVar6);
  if ((((iVar2 != 0xf) || (params.cParams.minMatch - 8 < 0xfffffffb)) ||
      (0x20000 < params.cParams.targetLength)) ||
     (params.cParams.strategy + ~ZSTD_btultra2 < 0xfffffff7)) {
    __assert_fail("!ZSTD_checkCParams(params.cParams)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x14c9,
                  "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_CCtx_params)"
                 );
  }
  (cdict->matchState).cParams.searchLog = (int)params.cParams._12_8_;
  (cdict->matchState).cParams.minMatch = (int)((ulong)params.cParams._12_8_ >> 0x20);
  (cdict->matchState).cParams.targetLength = (int)params.cParams._20_8_;
  (cdict->matchState).cParams.strategy = (int)((ulong)params.cParams._20_8_ >> 0x20);
  (cdict->matchState).cParams.windowLog = (int)params.cParams._0_8_;
  (cdict->matchState).cParams.chainLog = (int)((ulong)params.cParams._0_8_ >> 0x20);
  (cdict->matchState).cParams.hashLog = (int)params.cParams._8_8_;
  (cdict->matchState).cParams.searchLog = (int)((ulong)params.cParams._8_8_ >> 0x20);
  (cdict->matchState).dedicatedDictSearch = params.enableDedicatedDictSearch;
  if (((dictSize == 0) || (dictBuffer == (void *)0x0)) || (dictLoadMethod == ZSTD_dlm_byRef)) {
    cdict->dictContent = dictBuffer;
LAB_001b95cd:
    cdict->dictContentSize = dictSize;
    cdict->dictContentType = dictContentType;
    pUVar5 = (U32 *)(cdict->workspace).objectEnd;
    if (((ulong)pUVar5 & 7) != 0) {
LAB_001b9741:
      __assert_fail("(size_t)alloc % ZSTD_ALIGNOF(void*) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x1f2,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
    }
    ws = &cdict->workspace;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (((cdict->workspace).phase == ZSTD_cwksp_alloc_objects) &&
       (pUVar1 = pUVar5 + 0x880, pUVar1 <= (cdict->workspace).workspaceEnd)) {
      (cdict->workspace).objectEnd = pUVar1;
      (cdict->workspace).tableEnd = pUVar1;
      (cdict->workspace).tableValidEnd = pUVar1;
    }
    else {
      (cdict->workspace).allocFailed = '\x01';
      pUVar5 = (U32 *)0x0;
    }
    cdict->entropyWorkspace = pUVar5;
    (cdict->cBlockState).rep[0] = 1;
    (cdict->cBlockState).rep[1] = 4;
    (cdict->cBlockState).rep[2] = 8;
    (cdict->cBlockState).entropy.huf.repeatMode = HUF_repeat_none;
    (cdict->cBlockState).entropy.fse.offcode_repeatMode = FSE_repeat_none;
    (cdict->cBlockState).entropy.fse.matchlength_repeatMode = FSE_repeat_none;
    (cdict->cBlockState).entropy.fse.litlength_repeatMode = FSE_repeat_none;
    sVar4 = ZSTD_reset_matchState
                      (&cdict->matchState,ws,&params.cParams,params.useRowMatchFinder,
                       ZSTDcrp_makeClean,ZSTDirp_reset,ZSTD_resetTarget_CDict);
    if (sVar4 < 0xffffffffffffff89) {
      params.compressionLevel = 3;
      params.fParams.contentSizeFlag = 1;
      sVar4 = ZSTD_compress_insertDictionary
                        (&cdict->cBlockState,&cdict->matchState,(ldmState_t *)0x0,ws,&params,
                         cdict->dictContent,cdict->dictContentSize,dictContentType,ZSTD_dtlm_full,
                         ZSTD_tfp_forCDict,cdict->entropyWorkspace);
      if (sVar4 < 0xffffffffffffff89) {
        if (sVar4 >> 0x20 != 0) {
          __assert_fail("dictID <= (size_t)(U32)-1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x14ee,
                        "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_CCtx_params)"
                       );
        }
        cdict->dictID = (U32)sVar4;
        sVar4 = 0;
      }
    }
  }
  else {
    __dest = (cdict->workspace).objectEnd;
    if (((ulong)__dest & 7) != 0) goto LAB_001b9741;
    ZSTD_cwksp_assert_internal_consistency(&cdict->workspace);
    if (((cdict->workspace).phase == ZSTD_cwksp_alloc_objects) &&
       (pvVar3 = (void *)((dictSize + 7 & 0xfffffffffffffff8) + (long)__dest),
       pvVar3 <= (cdict->workspace).workspaceEnd)) {
      (cdict->workspace).objectEnd = pvVar3;
      (cdict->workspace).tableEnd = pvVar3;
      (cdict->workspace).tableValidEnd = pvVar3;
      if (__dest != (void *)0x0) {
        cdict->dictContent = __dest;
        memcpy(__dest,dictBuffer,dictSize);
        goto LAB_001b95cd;
      }
    }
    else {
      (cdict->workspace).allocFailed = '\x01';
    }
    sVar4 = 0xffffffffffffffc0;
  }
  return sVar4;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_CCtx_params params)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(params.cParams));
    cdict->matchState.cParams = params.cParams;
    cdict->matchState.dedicatedDictSearch = params.enableDedicatedDictSearch;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictContent = dictBuffer;
    } else {
         void *internalBuffer = ZSTD_cwksp_reserve_object(&cdict->workspace, ZSTD_cwksp_align(dictSize, sizeof(void*)));
        RETURN_ERROR_IF(!internalBuffer, memory_allocation, "NULL pointer!");
        cdict->dictContent = internalBuffer;
        ZSTD_memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;
    cdict->dictContentType = dictContentType;

    cdict->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cdict->workspace, HUF_WORKSPACE_SIZE);


    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    FORWARD_IF_ERROR(ZSTD_reset_matchState(
        &cdict->matchState,
        &cdict->workspace,
        &params.cParams,
        params.useRowMatchFinder,
        ZSTDcrp_makeClean,
        ZSTDirp_reset,
        ZSTD_resetTarget_CDict), "");
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is < 8 bytes.
     */
    {   params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, NULL, &cdict->workspace,
                    &params, cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, ZSTD_tfp_forCDict, cdict->entropyWorkspace);
            FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}